

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# maxvolume.cc
# Opt level: O0

Int __thiscall ipx::Maxvolume::RunSequential(Maxvolume *this,double *colscale,Basis *basis)

{
  bool bVar1;
  BasicStatus BVar2;
  Int IVar3;
  double *pdVar4;
  reference pvVar5;
  Basis *in_RDX;
  long in_RSI;
  Maxvolume *in_RDI;
  double dVar6;
  IndexedVector *pIVar7;
  bool exchanged;
  Int jb;
  anon_class_40_5_d735ebaa search_pivot;
  double vmax;
  Int pmax;
  double dj;
  Int j_1;
  vector<int,_std::allocator<int>_> candidates;
  Int updates_last;
  Int j;
  Int p;
  Vector invscale_basic;
  double volumetol;
  Int maxpasses;
  Int errflag;
  Timer timer;
  IndexedVector ftran;
  Int n;
  Int m;
  Model *model;
  undefined4 in_stack_fffffffffffffe38;
  Int in_stack_fffffffffffffe3c;
  Basis *in_stack_fffffffffffffe40;
  Basis *in_stack_fffffffffffffe48;
  vector<int,_std::allocator<int>_> *in_stack_fffffffffffffe50;
  undefined4 in_stack_fffffffffffffe58;
  Int in_stack_fffffffffffffe5c;
  int sys;
  Int in_stack_fffffffffffffe6c;
  int iVar8;
  IndexedVector *in_stack_fffffffffffffe70;
  undefined4 in_stack_fffffffffffffe78;
  Int in_stack_fffffffffffffe7c;
  IndexedVector *in_stack_fffffffffffffe80;
  undefined3 uVar9;
  Int in_stack_fffffffffffffe9c;
  Basis *in_stack_fffffffffffffea0;
  double *in_stack_fffffffffffffea8;
  Basis *in_stack_fffffffffffffeb0;
  BasicStatus in_stack_fffffffffffffeb8;
  Int in_stack_fffffffffffffebc;
  int local_11c;
  byte local_115;
  double local_e8;
  int local_dc;
  IndexedVector *local_d8;
  int local_cc;
  int local_ac;
  int local_a8;
  int local_a4;
  valarray<double> local_a0;
  double local_90;
  double local_88;
  double local_80;
  ipxint local_74;
  Int local_70;
  Int local_28;
  Int local_24;
  Model *local_20;
  undefined8 local_18;
  long local_10;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_20 = Basis::model(in_RDX);
  local_24 = Model::rows(local_20);
  local_28 = Model::cols(local_20);
  IndexedVector::IndexedVector(in_stack_fffffffffffffe70,in_stack_fffffffffffffe6c);
  Timer::Timer((Timer *)in_stack_fffffffffffffe40);
  local_70 = 0;
  local_74 = Control::maxpasses(in_RDI->control_);
  local_88 = Control::volume_tol(in_RDI->control_);
  local_90 = 1.0;
  pdVar4 = std::max<double>(&local_88,&local_90);
  local_80 = *pdVar4;
  std::valarray<double>::valarray
            ((valarray<double> *)in_stack_fffffffffffffe40,
             CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38));
  for (local_a4 = 0; local_a4 < local_24; local_a4 = local_a4 + 1) {
    in_stack_fffffffffffffebc =
         Basis::operator[](in_stack_fffffffffffffe40,in_stack_fffffffffffffe3c);
    local_a8 = in_stack_fffffffffffffebc;
    in_stack_fffffffffffffeb8 =
         Basis::StatusOf(in_stack_fffffffffffffe48,(Int)((ulong)in_stack_fffffffffffffe40 >> 0x20));
    if (in_stack_fffffffffffffeb8 == BASIC) {
      if (local_10 == 0) {
        in_stack_fffffffffffffea0 = (Basis *)0x3ff0000000000000;
      }
      else {
        in_stack_fffffffffffffea0 = (Basis *)(1.0 / *(double *)(local_10 + (long)local_a8 * 8));
      }
      in_stack_fffffffffffffeb0 = in_stack_fffffffffffffea0;
      in_stack_fffffffffffffea8 = std::valarray<double>::operator[](&local_a0,(long)local_a4);
      *in_stack_fffffffffffffea8 = (double)in_stack_fffffffffffffea0;
    }
  }
  Reset(in_RDI);
  do {
    uVar9 = (undefined3)in_stack_fffffffffffffe9c;
    in_stack_fffffffffffffe9c = CONCAT13(1,uVar9);
    if (local_74 <= in_RDI->passes_) {
      in_stack_fffffffffffffe9c = CONCAT13(local_74 < 0,uVar9);
    }
    if ((char)((uint)in_stack_fffffffffffffe9c >> 0x18) == '\0') break;
    in_RDI->tblnnz_ = 0;
    in_RDI->tblmax_ = 0.0;
    in_RDI->frobnorm_squared_ = 0.0;
    local_ac = 0;
    Sortperm(in_stack_fffffffffffffebc,(double *)in_stack_fffffffffffffeb0,
             SUB81((ulong)in_stack_fffffffffffffea8 >> 0x38,0));
    while (bVar1 = std::vector<int,_std::allocator<int>_>::empty(in_stack_fffffffffffffe50),
          ((bVar1 ^ 0xffU) & 1) != 0) {
      pvVar5 = std::vector<int,_std::allocator<int>_>::back
                         ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffe40);
      local_cc = *pvVar5;
      if (local_10 == 0) {
        pIVar7 = (IndexedVector *)0x3ff0000000000000;
      }
      else {
        pIVar7 = *(IndexedVector **)(local_10 + (long)local_cc * 8);
      }
      local_d8 = pIVar7;
      if (((double)pIVar7 == 0.0) && (!NAN((double)pIVar7))) break;
      BVar2 = Basis::StatusOf(in_stack_fffffffffffffe48,
                              (Int)((ulong)in_stack_fffffffffffffe40 >> 0x20));
      if (BVar2 == NONBASIC) {
        local_70 = Control::InterruptCheck
                             ((Control *)
                              CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8),
                              (Int)((ulong)in_stack_fffffffffffffeb0 >> 0x20));
        if (local_70 != 0) break;
        Basis::SolveForUpdate(in_stack_fffffffffffffea0,in_stack_fffffffffffffe9c,pIVar7);
        local_dc = -1;
        local_e8 = 0.0;
        for_each_nonzero<ipx::Maxvolume::RunSequential(double_const*,ipx::Basis&)::__0>
                  (in_stack_fffffffffffffe80,
                   (anon_class_40_5_d735ebaa *)
                   CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
        in_stack_fffffffffffffe80 = (IndexedVector *)std::max<double>(&in_RDI->tblmax_,&local_e8);
        in_RDI->tblmax_ = (double)(in_stack_fffffffffffffe80->elements_)._M_size;
        if (local_80 < local_e8) {
          IVar3 = Basis::operator[](in_stack_fffffffffffffe40,in_stack_fffffffffffffe3c);
          iVar8 = local_cc;
          in_stack_fffffffffffffe7c = IVar3;
          sys = local_18._4_4_;
          pdVar4 = IndexedVector::operator[]
                             ((IndexedVector *)in_stack_fffffffffffffe40,in_stack_fffffffffffffe3c);
          in_stack_fffffffffffffe5c =
               Basis::ExchangeIfStable
                         ((Basis *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78),
                          (Int)((ulong)pdVar4 >> 0x20),(Int)pdVar4,(double)CONCAT44(iVar8,IVar3),sys
                          ,(bool *)CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
          local_70 = in_stack_fffffffffffffe5c;
          if (in_stack_fffffffffffffe5c != 0) break;
          if ((local_115 & 1) != 0) {
            in_stack_fffffffffffffe48 = (Basis *)(1.0 / (double)local_d8);
            in_stack_fffffffffffffe50 =
                 (vector<int,_std::allocator<int>_> *)
                 std::valarray<double>::operator[](&local_a0,(long)local_dc);
            (in_stack_fffffffffffffe50->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
            super__Vector_impl_data._M_start = (pointer)in_stack_fffffffffffffe48;
            local_ac = local_ac + 1;
            dVar6 = log2(local_e8);
            in_RDI->volinc_ = dVar6 + in_RDI->volinc_;
            std::vector<int,_std::allocator<int>_>::pop_back
                      ((vector<int,_std::allocator<int>_> *)0x83d5e5);
          }
        }
        else {
          in_RDI->skipped_ = in_RDI->skipped_ + 1;
          std::vector<int,_std::allocator<int>_>::pop_back
                    ((vector<int,_std::allocator<int>_> *)0x83d4a2);
        }
      }
      else {
        std::vector<int,_std::allocator<int>_>::pop_back
                  ((vector<int,_std::allocator<int>_> *)0x83d33f);
      }
    }
    in_RDI->updates_ = local_ac + in_RDI->updates_;
    in_RDI->passes_ = in_RDI->passes_ + 1;
    if ((local_ac == 0) || (local_70 != 0)) {
      local_11c = 6;
    }
    else {
      local_11c = 0;
    }
    std::vector<int,_std::allocator<int>_>::~vector(in_stack_fffffffffffffe50);
  } while (local_11c == 0);
  pIVar7 = (IndexedVector *)Timer::Elapsed((Timer *)in_stack_fffffffffffffe40);
  in_RDI->time_ = (double)pIVar7;
  IVar3 = local_70;
  std::valarray<double>::~valarray((valarray<double> *)pIVar7);
  IndexedVector::~IndexedVector(pIVar7);
  return IVar3;
}

Assistant:

Int Maxvolume::RunSequential(const double* colscale, Basis& basis) {
    const Model& model = basis.model();
    const Int m = model.rows();
    const Int n = model.cols();
    IndexedVector ftran(m);
    Timer timer;
    Int errflag = 0;

    const Int maxpasses = control_.maxpasses();
    const double volumetol = std::max(control_.volume_tol(), 1.0);

    // Maintain a copy of the inverse scaling factors of basic variables.
    // If a variable has status BASIC_FREE, its inverse scaling factor is
    // assumed zero, regardless of the entry in colscale. This ensures that
    // BASIC_FREE variables are never pivoted out of the basis.
    Vector invscale_basic(m);
    for (Int p = 0; p < m; p++) {
        Int j = basis[p];
        if (basis.StatusOf(j) == Basis::BASIC)
            invscale_basic[p] = colscale ? 1.0/colscale[j] : 1.0;
    }

    Reset();
    while (passes_ < maxpasses || maxpasses < 0) {
        tblnnz_ = 0;
        tblmax_ = 0.0;
        frobnorm_squared_ = 0.0;
        Int updates_last = 0;   // # basis updates in this pass
        std::vector<Int> candidates = Sortperm(n+m, colscale, false);
        while(!candidates.empty()) {
            Int j = candidates.back();
            const double dj = colscale ? colscale[j] : 1.0;
            if (dj == 0.0)      // all remaining columns have scaling factor 0
                break;
            if (basis.StatusOf(j) != Basis::NONBASIC) {
                candidates.pop_back();
                continue;
            }
            if ((errflag = control_.InterruptCheck()) != 0)
                break;
            basis.SolveForUpdate(j, ftran);
            Int pmax = -1;
            double vmax = 0.0;
            auto search_pivot = [&](Int p, double x) {
                double v = std::abs(x) * invscale_basic[p] * dj;
                if (v > vmax) {
                    vmax = v;
                    pmax = p;
                }
                tblnnz_ += v != 0;
                frobnorm_squared_ += v*v;
            };
            for_each_nonzero(ftran, search_pivot);
            tblmax_ = std::max(tblmax_, vmax);
            if (vmax <= volumetol) {
                skipped_++;
                candidates.pop_back();
                continue;
            }

            const Int jb = basis[pmax];
            assert(basis.StatusOf(jb) == Basis::BASIC);
            bool exchanged;
            errflag = basis.ExchangeIfStable(jb, j, ftran[pmax], -1, &exchanged);
            if (errflag)
                break;
            if (!exchanged)     // factorization was unstable, try again
                continue;
            invscale_basic[pmax] = 1.0 / dj;
            updates_last++;
            volinc_ += std::log2(vmax);
            candidates.pop_back();
        }
        updates_ += updates_last;
        passes_++;
        if (updates_last == 0 || errflag != 0)
            break;
    }
    time_ = timer.Elapsed();
    return errflag;
}